

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall
QFileDialogListView::setFileDialogPrivate(QFileDialogListView *this,QFileDialogPrivate *d_pointer)

{
  this->d_ptr = d_pointer;
  QAbstractItemView::setSelectionBehavior((QAbstractItemView *)this,SelectRows);
  QListView::setWrapping(&this->super_QListView,true);
  QListView::setResizeMode(&this->super_QListView,Adjust);
  QAbstractItemView::setEditTriggers((QAbstractItemView *)this,(EditTriggers)0x8);
  QWidget::setContextMenuPolicy((QWidget *)this,CustomContextMenu);
  QAbstractItemView::setDragDropMode((QAbstractItemView *)this,InternalMove);
  return;
}

Assistant:

void QFileDialogListView::setFileDialogPrivate(QFileDialogPrivate *d_pointer)
{
    d_ptr = d_pointer;
    setSelectionBehavior(QAbstractItemView::SelectRows);
    setWrapping(true);
    setResizeMode(QListView::Adjust);
    setEditTriggers(QAbstractItemView::EditKeyPressed);
    setContextMenuPolicy(Qt::CustomContextMenu);
#if QT_CONFIG(draganddrop)
    setDragDropMode(QAbstractItemView::InternalMove);
#endif
}